

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  U32 mls;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  
  if (ms->dictMatchState != (ZSTD_matchState_t *)0x0) {
    switch((ms->cParams).minMatch) {
    default:
      ms_local = (ZSTD_matchState_t *)
                 ZSTD_compressBlock_fast_dictMatchState_4_0(ms,seqStore,rep,src,srcSize);
      break;
    case 5:
      ms_local = (ZSTD_matchState_t *)
                 ZSTD_compressBlock_fast_dictMatchState_5_0(ms,seqStore,rep,src,srcSize);
      break;
    case 6:
      ms_local = (ZSTD_matchState_t *)
                 ZSTD_compressBlock_fast_dictMatchState_6_0(ms,seqStore,rep,src,srcSize);
      break;
    case 7:
      ms_local = (ZSTD_matchState_t *)
                 ZSTD_compressBlock_fast_dictMatchState_7_0(ms,seqStore,rep,src,srcSize);
    }
    return (size_t)ms_local;
  }
  __assert_fail("ms->dictMatchState != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_fast.c"
                ,0x29c,
                "size_t ZSTD_compressBlock_fast_dictMatchState(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
               );
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_4_0(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_5_0(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_6_0(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_7_0(ms, seqStore, rep, src, srcSize);
    }
}